

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.cpp
# Opt level: O2

string * __thiscall
helics::BasicHandleInfo::getTag_abi_cxx11_(BasicHandleInfo *this,string_view tag)

{
  pointer ppVar1;
  bool bVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tg;
  pointer ppVar3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  ppVar3 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->tags).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar3 == ppVar1) {
      return (string *)&emptyString_abi_cxx11_;
    }
    __y._M_str = (ppVar3->first)._M_dataplus._M_p;
    __y._M_len = (ppVar3->first)._M_string_length;
    bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)tag,__y);
    if (bVar2) break;
    ppVar3 = ppVar3 + 1;
  }
  return (string *)&ppVar3->second;
}

Assistant:

const std::string& BasicHandleInfo::getTag(std::string_view tag) const
{
    for (const auto& tg : tags) {
        if (tg.first == tag) {
            return tg.second;
        }
    }
    return emptyString;
}